

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode * __thiscall JSONNode::at(JSONNode *this,json_string *name_t)

{
  internalJSONNode *piVar1;
  uchar uVar2;
  json_string *__lhs;
  out_of_range *this_00;
  string *psVar3;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  JSONNode **local_78;
  JSONNode **res;
  allocator local_39;
  json_string local_38;
  json_string *local_18;
  json_string *name_t_local;
  JSONNode *this_local;
  
  piVar1 = this->internal;
  local_18 = name_t;
  name_t_local = (json_string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar2 = type(this);
  __lhs = jsonSingletonERROR_NON_ITERATABLE::getValue_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,__lhs,
                 "at");
  JSONDebug::_JSON_ASSERT(uVar2 == '\x05',(json_string *)&res);
  std::__cxx11::string::~string((string *)&res);
  makeUniqueInternal(this);
  local_78 = internalJSONNode::at(this->internal,local_18);
  if (local_78 != (JSONNode **)0x0) {
    return *local_78;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"at could not find child by name: ",&local_b9);
  std::operator+(&local_98,&local_b8,local_18);
  JSONDebug::_JSON_FAIL(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar3 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar3);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("at"));
    makeUniqueInternal();
    if (JSONNode ** res = internal -> at(name_t)){
	   return *(*res);
    }
    JSON_FAIL(json_string(JSON_TEXT("at could not find child by name: ")) + name_t);
    json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
}